

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void SortByDistance(int *aIdx,int nIdx,RtreeDValue *aDistance,int *aSpare)

{
  int *aIdx_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  int nIdx_00;
  uint nIdx_01;
  
  if (1 < nIdx) {
    nIdx_01 = (uint)nIdx >> 1;
    nIdx_00 = nIdx - nIdx_01;
    aIdx_00 = aIdx + nIdx_01;
    SortByDistance(aIdx,nIdx_01,aDistance,aSpare);
    SortByDistance(aIdx_00,nIdx_00,aDistance,aSpare);
    memcpy(aSpare,aIdx,(ulong)nIdx_01 * 4);
    uVar2 = 0;
    iVar3 = 0;
    do {
      if (uVar2 == nIdx_01) {
        aIdx[(int)(uVar2 + iVar3)] = aIdx_00[iVar3];
LAB_001ce095:
        iVar3 = iVar3 + 1;
      }
      else {
        iVar1 = aSpare[(int)uVar2];
        if (iVar3 == nIdx_00) {
          aIdx[(int)(uVar2 + iVar3)] = iVar1;
        }
        else {
          if (aDistance[aIdx_00[iVar3]] < aDistance[iVar1] ||
              aDistance[aIdx_00[iVar3]] == aDistance[iVar1]) {
            aIdx[(int)(uVar2 + iVar3)] = aIdx_00[iVar3];
            goto LAB_001ce095;
          }
          aIdx[(int)(uVar2 + iVar3)] = iVar1;
        }
        uVar2 = uVar2 + 1;
      }
    } while (iVar3 < nIdx_00 || (int)uVar2 < (int)nIdx_01);
  }
  return;
}

Assistant:

static void SortByDistance(
  int *aIdx, 
  int nIdx, 
  RtreeDValue *aDistance, 
  int *aSpare
){
  if( nIdx>1 ){
    int iLeft = 0;
    int iRight = 0;

    int nLeft = nIdx/2;
    int nRight = nIdx-nLeft;
    int *aLeft = aIdx;
    int *aRight = &aIdx[nLeft];

    SortByDistance(aLeft, nLeft, aDistance, aSpare);
    SortByDistance(aRight, nRight, aDistance, aSpare);

    memcpy(aSpare, aLeft, sizeof(int)*nLeft);
    aLeft = aSpare;

    while( iLeft<nLeft || iRight<nRight ){
      if( iLeft==nLeft ){
        aIdx[iLeft+iRight] = aRight[iRight];
        iRight++;
      }else if( iRight==nRight ){
        aIdx[iLeft+iRight] = aLeft[iLeft];
        iLeft++;
      }else{
        RtreeDValue fLeft = aDistance[aLeft[iLeft]];
        RtreeDValue fRight = aDistance[aRight[iRight]];
        if( fLeft<fRight ){
          aIdx[iLeft+iRight] = aLeft[iLeft];
          iLeft++;
        }else{
          aIdx[iLeft+iRight] = aRight[iRight];
          iRight++;
        }
      }
    }

#if 0
    /* Check that the sort worked */
    {
      int jj;
      for(jj=1; jj<nIdx; jj++){
        RtreeDValue left = aDistance[aIdx[jj-1]];
        RtreeDValue right = aDistance[aIdx[jj]];
        assert( left<=right );
      }
    }
#endif
  }
}